

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_diamond_box.cxx
# Opt level: O3

void fl_diamond_down_box(int x,int y,int w,int h,Fl_Color bgcolor)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  uVar6 = w & 0xfffffffe;
  uVar1 = h & 0xfffffffe;
  uVar3 = (w >> 1) + x;
  uVar4 = (h >> 1) + y;
  puVar2 = fl_gray_ramp();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x50]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar4,(ulong)uVar3,(ulong)(uint)y,
             (ulong)(uVar6 + x),uVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x4e]);
  uVar5 = (uVar6 - 1) + x;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)uVar4,(ulong)uVar3,(ulong)(y + 1),
             (ulong)uVar5,uVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x48]);
  uVar8 = (uVar6 - 2) + x;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar4,(ulong)uVar3,(ulong)(y + 2),
             (ulong)uVar8,uVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x57]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar4,(ulong)uVar3,(ulong)((uVar1 + y) - 2),
             (ulong)uVar8,uVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x55]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(x + 1U),(ulong)uVar4,(ulong)uVar3,(ulong)((uVar1 + y) - 1),
             (ulong)uVar5,uVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x53]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xd])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar4,(ulong)uVar3,(ulong)(uVar1 + y),
             (ulong)(uVar6 + x),uVar4);
  Fl::set_box_color(bgcolor);
  uVar5 = (x + uVar6) - 3;
  iVar7 = (uVar1 - 3) + y;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x17])
            (fl_graphics_driver,(ulong)(x + 3U),(ulong)uVar4,(ulong)uVar3,(ulong)(y + 3U),
             (ulong)uVar5,uVar4,uVar3,iVar7);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)puVar2[0x41]);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x15])
            (fl_graphics_driver,(ulong)(x + 3U),(ulong)uVar4,(ulong)uVar3,(ulong)(y + 3U),
             (ulong)uVar5,uVar4,uVar3,iVar7);
  return;
}

Assistant:

static void fl_diamond_down_box(int x,int y,int w,int h,Fl_Color bgcolor) {
  w &= -2;
  h &= -2;
  int x1 = x+w/2;
  int y1 = y+h/2;
  const uchar *g = fl_gray_ramp();
  fl_color(g[(int)'P']); fl_line(x+0, y1, x1, y+0, x+w-0, y1);
  fl_color(g[(int)'N']); fl_line(x+1, y1, x1, y+1, x+w-1, y1);
  fl_color(g[(int)'H']); fl_line(x+2, y1, x1, y+2, x+w-2, y1);
  fl_color(g[(int)'W']); fl_line(x+2, y1, x1, y+h-2, x+w-2, y1);
  fl_color(g[(int)'U']); fl_line(x+1, y1, x1, y+h-1, x+w-1, y1);
  fl_color(g[(int)'S']); fl_line(x+0, y1, x1, y+h-0, x+w-0, y1);
  Fl::set_box_color(bgcolor);
  fl_polygon(x+3, y1, x1,y+3, x+w-3,y1, x1,y+h-3);
  fl_color(g[(int)'A']); fl_loop(x+3, y1, x1, y+3, x+w-3, y1, x1, y+h-3);
}